

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O3

size_t duckdb_zstd::FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  short sVar1;
  ushort uVar2;
  short sVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  FSE_CTable FVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  FSE_CTable FVar18;
  int iVar20;
  size_t s;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ulong uVar19;
  
  uVar27 = 1 << ((byte)tableLog & 0x1f);
  uVar23 = (ulong)uVar27;
  uVar11 = 1;
  if (tableLog != 0) {
    uVar11 = (ulong)(uVar27 >> 1);
  }
  uVar16 = maxSymbolValue + 2;
  uVar19 = (ulong)uVar16;
  if (wkspSize < ((1L << ((byte)tableLog & 0x3f)) + uVar19 & 0xfffffffffffffffe) * 2 + 8) {
    return 0xffffffffffffffd4;
  }
  uVar12 = uVar27 - 1;
  iVar26 = (uVar27 >> 3) + (uVar27 >> 1) + 3;
  *(short *)ct = (short)tableLog;
  *(short *)((long)ct + 2) = (short)maxSymbolValue;
  *(undefined2 *)workSpace = 0;
  uVar24 = maxSymbolValue + 1;
  uVar22 = (ulong)uVar24;
  sVar3 = (short)uVar27;
  if (uVar24 == 0) {
    *(short *)workSpace = sVar3 + 1;
  }
  else {
    uVar9 = 2;
    if (2 < uVar16) {
      uVar9 = (ulong)uVar16;
    }
    lVar14 = 0;
    uVar16 = uVar12;
    do {
      sVar1 = *(short *)((long)workSpace + lVar14 * 2);
      if (normalizedCounter[lVar14] == -1) {
        *(short *)((long)workSpace + lVar14 * 2 + 2) = sVar1 + 1;
        uVar10 = (ulong)uVar16;
        uVar16 = uVar16 - 1;
        *(char *)((long)workSpace + uVar10 + uVar19 * 2) = (char)lVar14;
      }
      else {
        *(short *)((long)workSpace + lVar14 * 2 + 2) = sVar1 + normalizedCounter[lVar14];
      }
      lVar14 = lVar14 + 1;
    } while (uVar9 - 1 != lVar14);
    *(short *)((long)workSpace + uVar22 * 2) = sVar3 + 1;
    auVar6 = _DAT_012b0ff0;
    auVar5 = _DAT_012b0fe0;
    if (uVar16 != uVar12) {
      if (uVar24 != 0) {
        uVar9 = 0;
        uVar10 = 0;
        do {
          sVar1 = normalizedCounter[uVar9];
          if (0 < sVar1) {
            iVar20 = 0;
            do {
              *(char *)((long)workSpace + uVar10 + uVar19 * 2) = (char)uVar9;
              do {
                uVar17 = (int)uVar10 + iVar26 & uVar12;
                uVar10 = (ulong)uVar17;
              } while (uVar16 < uVar17);
              iVar20 = iVar20 + 1;
            } while (iVar20 != sVar1);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar22);
      }
      goto LAB_01280cfe;
    }
    lVar14 = uVar23 + uVar19 * 2;
    if (uVar24 != 0) {
      uVar9 = 0;
      lVar21 = 0;
      lVar25 = 0;
      do {
        uVar2 = normalizedCounter[uVar9];
        *(long *)((long)workSpace + lVar21 + lVar14) = lVar25;
        if (8 < (long)(short)uVar2) {
          uVar7 = 0x10;
          if (0x10 < uVar2) {
            uVar7 = uVar2;
          }
          lVar4 = lVar21 + lVar14;
          uVar10 = (ulong)uVar7 - 9;
          auVar30._8_4_ = (int)uVar10;
          auVar30._0_8_ = uVar10;
          auVar30._12_4_ = (int)(uVar10 >> 0x20);
          auVar28._0_8_ = uVar10 >> 3;
          auVar28._8_8_ = auVar30._8_8_ >> 3;
          auVar28 = auVar28 ^ auVar6;
          uVar15 = 0;
          do {
            auVar29._8_4_ = (int)uVar15;
            auVar29._0_8_ = uVar15;
            auVar29._12_4_ = (int)(uVar15 >> 0x20);
            auVar30 = (auVar29 | auVar5) ^ auVar6;
            if ((bool)(~(auVar28._4_4_ < auVar30._4_4_ ||
                        auVar28._0_4_ < auVar30._0_4_ && auVar30._4_4_ == auVar28._4_4_) & 1)) {
              *(long *)((long)workSpace + uVar15 * 8 + lVar4 + 8) = lVar25;
            }
            if (auVar30._12_4_ <= auVar28._12_4_ &&
                (auVar30._8_4_ <= auVar28._8_4_ || auVar30._12_4_ != auVar28._12_4_)) {
              *(long *)((long)workSpace + uVar15 * 8 + lVar4 + 0x10) = lVar25;
            }
            uVar15 = uVar15 + 2;
          } while (((uVar10 >> 3) + 2 & 0xfffffffffffffffe) != uVar15);
        }
        lVar21 = lVar21 + (short)uVar2;
        uVar9 = uVar9 + 1;
        lVar25 = lVar25 + 0x101010101010101;
      } while (uVar9 != uVar22);
    }
  }
  lVar14 = uVar23 + uVar19 * 2;
  uVar22 = 0;
  uVar16 = 0;
  do {
    *(undefined1 *)((long)workSpace + (ulong)(uVar16 & uVar12) + uVar19 * 2) =
         *(undefined1 *)((long)workSpace + uVar22 + lVar14);
    *(undefined1 *)((long)workSpace + (ulong)(uVar16 + iVar26 & uVar12) + uVar19 * 2) =
         *(undefined1 *)((long)workSpace + uVar22 + lVar14 + 1);
    uVar16 = uVar16 + iVar26 * 2 & uVar12;
    uVar22 = uVar22 + 2;
  } while (uVar22 < uVar23);
LAB_01280cfe:
  uVar22 = 0;
  do {
    uVar9 = (ulong)*(byte *)((long)workSpace + uVar22 + uVar19 * 2);
    uVar2 = *(ushort *)((long)workSpace + uVar9 * 2);
    *(ushort *)((long)workSpace + uVar9 * 2) = uVar2 + 1;
    *(short *)((long)ct + (ulong)uVar2 * 2 + 4) = sVar3 + (short)uVar22;
    uVar22 = uVar22 + 1;
  } while (uVar23 != uVar22);
  FVar8 = tableLog * 0x10000 - uVar27;
  uVar23 = 0;
  iVar26 = 0;
  do {
    sVar3 = normalizedCounter[uVar23];
    if ((sVar3 == -1) || (sVar3 == 1)) {
      ct[uVar11 + uVar23 * 2 + 2] = FVar8;
      ct[uVar11 + uVar23 * 2 + 1] = iVar26 - 1;
      iVar26 = iVar26 + 1;
    }
    else if (sVar3 == 0) {
      ct[uVar11 + uVar23 * 2 + 2] = FVar8 + 0x10000;
    }
    else {
      iVar13 = (int)sVar3;
      iVar20 = 0x1f;
      if (iVar13 - 1U != 0) {
        for (; iVar13 - 1U >> iVar20 == 0; iVar20 = iVar20 + -1) {
        }
      }
      FVar18 = iVar26 - iVar13;
      iVar26 = iVar26 + iVar13;
      ct[uVar11 + uVar23 * 2 + 2] =
           (tableLog - iVar20) * 0x10000 - (iVar13 << ((byte)(tableLog - iVar20) & 0x1f));
      ct[uVar11 + uVar23 * 2 + 1] = FVar18;
    }
    uVar23 = uVar23 + 1;
  } while (uVar24 + (uVar24 == 0) != uVar23);
  return 0;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 const maxSV1 = maxSymbolValue+1;

    U16* cumul = (U16*)workSpace;   /* size = maxSV1 */
    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSV1+1));  /* size = tableSize */

    U32 highThreshold = tableSize-1;

    assert(((size_t)workSpace & 1) == 0);  /* Must be 2 bytes-aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * https://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSV1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                assert(normalizedCounter[u-1] >= 0);
                cumul[u] = cumul[u-1] + (U16)normalizedCounter[u-1];
                assert(cumul[u] >= cumul[u-1]);  /* no overflow */
        }   }
        cumul[maxSV1] = (U16)(tableSize+1);
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        /* Case for no low prob count symbols. Lay down 8 bytes at a time
         * to reduce branch misses since we are operating on a small block
         */
        BYTE* const spread = tableSymbol + tableSize; /* size = tableSize + 8 (may write beyond tableSize) */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                assert(n>=0);
                pos += (size_t)n;
            }
        }
        /* Spread symbols across the table. Lack of lowprob symbols means that
         * we don't need variable sized inner loop, so we can unroll the loop and
         * reduce branch misses.
         */
        {   size_t position = 0;
            size_t s;
            size_t const unroll = 2; /* Experimentally determined optimal unroll */
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableSymbol[uPosition] = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);   /* Must have initialized all positions */
        }
    } else {
        U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<maxSV1; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }
        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                assert(total <= INT_MAX);
                symbolTT[s].deltaFindState = (int)(total - 1);
                total ++;
                break;
            default :
                assert(normalizedCounter[s] > 1);
                {   U32 const maxBitsOut = tableLog - ZSTD_highbit32 ((U32)normalizedCounter[s]-1);
                    U32 const minStatePlus = (U32)normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = (int)(total - (unsigned)normalizedCounter[s]);
                    total +=  (unsigned)normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
    }   }
#endif

    return 0;
}